

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O3

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>>
               (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *rhs,
               Transpose<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *dest,
               Scalar *alpha)

{
  non_const_type pMVar1;
  ulong uVar2;
  non_const_type pMVar3;
  long cols;
  long rows;
  ResScalar *res;
  undefined8 *puVar4;
  double *__ptr;
  double *pdVar5;
  Scalar alpha_00;
  double dStack_58;
  const_blas_data_mapper<double,_long,_1> local_50;
  const_blas_data_mapper<double,_long,_0> local_40;
  Scalar local_30;
  
  pdVar5 = &dStack_58;
  pMVar1 = (rhs->m_matrix).m_matrix;
  uVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar2 >> 0x3d == 0) {
    pMVar3 = lhs->m_matrix;
    alpha_00 = *alpha;
    local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (double *)0x0) {
      if (uVar2 < 0x4001) {
        local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)((long)&dStack_58 - (uVar2 * 8 + 0x1e & 0xfffffffffffffff0));
        __ptr = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        pdVar5 = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
      }
      else {
        local_30 = alpha_00;
        local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)malloc(uVar2 * 8);
        if (((ulong)local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data & 0xf) != 0)
        {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        __ptr = local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        alpha_00 = local_30;
        if (local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (double *)0x0)
        goto LAB_0013999c;
      }
    }
    else {
      __ptr = (double *)0x0;
      pdVar5 = &dStack_58;
    }
    cols = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
    rows = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    local_50.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    local_40.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
    pMVar1 = (dest->m_matrix).m_matrix;
    res = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_50.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = cols;
    if ((res != (ResScalar *)0x0) &&
       ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        0)) {
      pdVar5[-1] = 6.34669317662978e-318;
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1, true>, Level = 0]"
                   );
    }
    pdVar5[-1] = 6.34616452638873e-318;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
    ::run(rows,cols,&local_50,&local_40,res,1,alpha_00);
    if (0x4000 < uVar2) {
      pdVar5[-1] = 6.34624851754852e-318;
      free(__ptr);
    }
    return;
  }
LAB_0013999c:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = std::random_device::_M_fini;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }